

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintExtensionsInDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Descriptor *pDStack_18;
  bool is_extension;
  Descriptor *message_descriptor_local;
  Generator *this_local;
  
  local_19 = 1;
  pDStack_18 = message_descriptor;
  message_descriptor_local = (Descriptor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"extensions",&local_41);
  PrintFieldDescriptorsInDescriptor(this,message_descriptor,true,&local_40,0x2586f0,0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Generator::PrintExtensionsInDescriptor(
    const Descriptor& message_descriptor) const {
  const bool is_extension = true;
  PrintFieldDescriptorsInDescriptor(
      message_descriptor, is_extension, "extensions",
      &Descriptor::extension_count, &Descriptor::extension);
}